

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

char * cram_block_method2str(cram_block_method m)

{
  if ((uint)m < 0xc) {
    return &DAT_00147eb8 + *(int *)(&DAT_00147eb8 + (ulong)(uint)m * 4);
  }
  return "?";
}

Assistant:

char *cram_block_method2str(enum cram_block_method m) {
    switch(m) {
    case RAW:	   return "RAW";
    case GZIP:	   return "GZIP";
    case BZIP2:	   return "BZIP2";
    case LZMA:     return "LZMA";
    case RANS0:    return "RANS0";
    case RANS1:    return "RANS1";
    case GZIP_RLE: return "GZIP_RLE";
    case ERROR:    break;
    }
    return "?";
}